

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,char_const*,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,char *significand,
          int significand_size,int integral_size,wchar_t decimal_point,
          digit_grouping<wchar_t> *grouping)

{
  wchar_t wVar1;
  type tVar2;
  wchar_t *pwVar3;
  wchar_t *end;
  basic_string_view<wchar_t> local_878;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_868;
  buffer<wchar_t> *local_860;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_858 [3];
  allocator<wchar_t> local_839;
  undefined1 local_838 [8];
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> buffer;
  digit_grouping<wchar_t> *grouping_local;
  wchar_t decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  char *significand_local;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_local;
  
  wVar1 = digit_grouping<wchar_t>::separator(grouping);
  if (wVar1 == L'\0') {
    buffer._2032_8_ = out.container;
    out_local = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>
                          (out,significand,significand_size,integral_size,decimal_point);
  }
  else {
    std::allocator<wchar_t>::allocator();
    basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::basic_memory_buffer
              ((basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *)local_838,&local_839
              );
    std::allocator<wchar_t>::~allocator(&local_839);
    std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::back_insert_iterator
              (local_858,(buffer<wchar_t> *)local_838);
    local_860 = (buffer<wchar_t> *)
                write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>
                          (local_858[0],significand,significand_size,integral_size,decimal_point);
    local_868.container = out.container;
    pwVar3 = buffer<wchar_t>::data((buffer<wchar_t> *)local_838);
    tVar2 = to_unsigned<int>(integral_size);
    basic_string_view<wchar_t>::basic_string_view(&local_878,pwVar3,(ulong)tVar2);
    digit_grouping<wchar_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>
              (grouping,local_868,local_878);
    pwVar3 = buffer<wchar_t>::data((buffer<wchar_t> *)local_838);
    end = buffer<wchar_t>::end((buffer<wchar_t> *)local_838);
    out_local = copy_str_noinline<wchar_t,wchar_t*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                          (pwVar3 + integral_size,end,out);
    basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer
              ((basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *)local_838);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out_local.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}